

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O2

void __thiscall Liby::TcpClient::TcpClient(TcpClient *this,EventLoop *loop,SockPtr *socket)

{
  Poller *pPVar1;
  
  (this->super_enable_shared_from_this<Liby::TcpClient>)._M_weak_this.
  super___weak_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Liby::TcpClient>)._M_weak_this.
  super___weak_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  TimerMixin::TimerMixin(&this->super_TimerMixin);
  (this->super_TimerMixin)._vptr_TimerMixin = (_func_int **)&PTR__TcpClient_00132760;
  (this->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->loop_ = loop;
  pPVar1 = EventLoop::getPoller(loop);
  this->poller_ = pPVar1;
  std::__shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>,
             &socket->super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>);
  (this->self_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->self_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->connector_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->connector_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->connector_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->connector_).super__Function_base._M_functor + 8) = 0;
  (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

TcpClient::TcpClient(EventLoop *loop, SockPtr socket)
    : loop_(loop), poller_(loop->getPoller()), socket_(socket) {}